

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

bool __thiscall pbrt::BilinearPatch::IntersectP(BilinearPatch *this,Ray *ray,Float tMax)

{
  Point3f *pPVar1;
  bool bVar2;
  long in_RDI;
  Point3f p11;
  Point3f p01;
  Point3f p10;
  Point3f p00;
  int *v;
  BilinearPatchMesh *mesh;
  Float in_stack_00000884;
  Ray *in_stack_00000888;
  Tuple3<pbrt::Point3,_float> in_stack_000008a0;
  Tuple3<pbrt::Point3,_float> in_stack_000008c0;
  Tuple3<pbrt::Point3,_float> in_stack_000008e0;
  Tuple3<pbrt::Point3,_float> in_stack_00000900;
  optional<pbrt::BilinearIntersection> local_78;
  undefined8 local_68;
  float local_60;
  undefined8 local_58;
  float local_50;
  undefined8 local_48;
  float local_40;
  undefined8 local_38;
  float local_30;
  int *local_28;
  BilinearPatchMesh *local_20;
  
  local_20 = GetMesh((BilinearPatch *)0x468ee2);
  local_28 = local_20->vertexIndices + (*(int *)(in_RDI + 4) << 2);
  local_30 = local_20->p[*local_28].super_Tuple3<pbrt::Point3,_float>.z;
  pPVar1 = local_20->p + *local_28;
  local_38._0_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
  local_38._4_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
  local_40 = local_20->p[local_28[1]].super_Tuple3<pbrt::Point3,_float>.z;
  pPVar1 = local_20->p + local_28[1];
  local_48._0_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
  local_48._4_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
  local_50 = local_20->p[local_28[2]].super_Tuple3<pbrt::Point3,_float>.z;
  pPVar1 = local_20->p + local_28[2];
  local_58._0_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
  local_58._4_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
  local_60 = local_20->p[local_28[3]].super_Tuple3<pbrt::Point3,_float>.z;
  pPVar1 = local_20->p + local_28[3];
  local_68._0_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
  local_68._4_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
  IntersectBilinearPatch
            (in_stack_00000888,in_stack_00000884,(Point3f)in_stack_000008e0,
             (Point3f)in_stack_000008c0,(Point3f)in_stack_000008a0,(Point3f)in_stack_00000900);
  bVar2 = pstd::optional<pbrt::BilinearIntersection>::has_value(&local_78);
  pstd::optional<pbrt::BilinearIntersection>::~optional
            ((optional<pbrt::BilinearIntersection> *)0x4690ff);
  return bVar2;
}

Assistant:

PBRT_CPU_GPU bool BilinearPatch::IntersectP(const Ray &ray, Float tMax) const {
    const BilinearPatchMesh *mesh = GetMesh();
    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    Point3f p00 = mesh->p[v[0]], p10 = mesh->p[v[1]];
    Point3f p01 = mesh->p[v[2]], p11 = mesh->p[v[3]];

    return IntersectBilinearPatch(ray, tMax, p00, p10, p01, p11).has_value();
}